

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

ParameterError file2memory(char **bufp,size_t *size,FILE *file)

{
  CURLcode CVar1;
  size_t sVar2;
  char *pcVar3;
  undefined1 local_1058 [8];
  char buffer [4096];
  undefined1 local_50 [8];
  dynbuf dyn;
  size_t nread;
  FILE *file_local;
  size_t *size_local;
  char **bufp_local;
  
  if (file == (FILE *)0x0) {
    *size = 0;
    *bufp = (char *)0x0;
  }
  else {
    curlx_dyn_init((dynbuf *)local_50,0x40000000);
    do {
      dyn.toobig = fread(local_1058,1,0x1000,(FILE *)file);
      if ((dyn.toobig != 0) &&
         (CVar1 = curlx_dyn_addn((dynbuf *)local_50,local_1058,dyn.toobig), CVar1 != CURLE_OK)) {
        return PARAM_NO_MEM;
      }
    } while (dyn.toobig != 0);
    sVar2 = curlx_dyn_len((dynbuf *)local_50);
    *size = sVar2;
    pcVar3 = curlx_dyn_ptr((dynbuf *)local_50);
    *bufp = pcVar3;
  }
  return PARAM_OK;
}

Assistant:

ParameterError file2memory(char **bufp, size_t *size, FILE *file)
{
  if(file) {
    size_t nread;
    struct curlx_dynbuf dyn;
    curlx_dyn_init(&dyn, MAX_FILE2MEMORY);
    do {
      char buffer[4096];
      nread = fread(buffer, 1, sizeof(buffer), file);
      if(nread)
        if(curlx_dyn_addn(&dyn, buffer, nread))
          return PARAM_NO_MEM;
    } while(nread);
    *size = curlx_dyn_len(&dyn);
    *bufp = curlx_dyn_ptr(&dyn);
  }
  else {
    *size = 0;
    *bufp = NULL;
  }
  return PARAM_OK;
}